

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O0

int spec_dbon(obj *otmp,obj *olaunch,boolean thrown,monst *mon,int tmp)

{
  uchar uVar1;
  ushort uVar2;
  boolean bVar3;
  char cVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  int local_74;
  int local_70;
  obj *local_68;
  artifact *local_60;
  int local_54;
  uchar adtyp;
  int dmg_bonus;
  obj *defwep;
  int propdmg;
  boolean yours;
  artifact *weap;
  int tmp_local;
  monst *mon_local;
  boolean thrown_local;
  obj *olaunch_local;
  obj *otmp_local;
  
  if ((otmp == (obj *)0x0) || (otmp->oartifact == '\0')) {
    local_60 = (artifact *)0x0;
  }
  else {
    local_60 = artilist + (int)otmp->oartifact;
  }
  bVar6 = mon == &youmonst;
  spec_dbon_applies = 0;
  spec_applies_ad_fire = '\0';
  spec_applies_ad_cold = '\0';
  spec_applies_ad_elec = '\0';
  spec_applies_ad_magm = '\0';
  spec_applies_ad_stun = '\0';
  spec_applies_ad_drli = '\0';
  spec_applies_spfx_behead = spec_ability(otmp,0x400);
  if (local_60 != (artifact *)0x0) {
    if ((local_60 == (artifact *)0x0) ||
       ((((local_60->attk).adtyp == '\0' && ((local_60->attk).damn == '\0')) &&
        ((local_60->attk).damd == '\0')))) {
      spec_dbon_applies = 0;
    }
    else {
      spec_dbon_applies = spec_applies(local_60,mon);
    }
    if (spec_dbon_applies != 0) {
      if ((local_60->attk).damd == '\0') {
        local_74 = tmp;
        if (tmp < 2) {
          local_74 = 1;
        }
        local_70 = local_74;
      }
      else {
        local_70 = rnd((uint)(local_60->attk).damd);
      }
      local_54 = local_70;
      if (((bVar6) && ((local_60->spfx & 0x40) != 0)) &&
         ((((((uVar1 = (local_60->attk).adtyp, uVar1 == '\x02' &&
              (((u.uprops[1].intrinsic & 0x4000000) != 0 &&
               ((u.uprops[1].intrinsic & 0xfbffffff) == 0)))) && (u.uprops[1].extrinsic == 0)) &&
            ((youmonst.mintrinsics & 1) == 0)) ||
           ((((uVar1 == '\x03' && ((u.uprops[2].intrinsic & 0x4000000) != 0)) &&
             ((u.uprops[2].intrinsic & 0xfbffffff) == 0)) &&
            ((u.uprops[2].extrinsic == 0 && ((youmonst.mintrinsics & 2) == 0)))))) ||
          ((((uVar1 == '\x06' &&
             (((u.uprops[5].intrinsic & 0x4000000) != 0 &&
              ((u.uprops[5].intrinsic & 0xfbffffff) == 0)))) &&
            ((u.uprops[5].extrinsic == 0 && ((youmonst.mintrinsics & 0x10) == 0)))) ||
           ((((uVar1 == '\a' && ((u.uprops[6].intrinsic & 0x4000000) != 0)) &&
             ((u.uprops[6].intrinsic & 0xfbffffff) == 0)) &&
            ((u.uprops[6].extrinsic == 0 && ((youmonst.mintrinsics & 0x20) == 0)))))))))) {
        local_54 = (local_70 + 1) / 2;
      }
      return local_54;
    }
    return 0;
  }
  defwep._0_4_ = 0;
  if (bVar6) {
    local_68 = uwep;
  }
  else {
    local_68 = mon->mw;
  }
  bVar3 = attacks(2,otmp,olaunch,thrown);
  if (bVar3 != '\0') {
    if (bVar6) {
      if (((u.uprops[1].intrinsic != 0) || (u.uprops[1].extrinsic != 0)) ||
         ((youmonst.mintrinsics & 1) != 0)) {
        if ((((u.uprops[1].intrinsic & 0x4000000) == 0) ||
            ((u.uprops[1].intrinsic & 0xfbffffff) != 0)) ||
           (uVar2 = youmonst.mintrinsics, u.uprops[1].extrinsic != 0)) goto LAB_0015977a;
        goto joined_r0x001596a4;
      }
    }
    else {
      uVar2 = mon->mintrinsics;
joined_r0x001596a4:
      if ((uVar2 & 1) != 0) goto LAB_0015977a;
    }
    if (((local_68 == (obj *)0x0) || (local_68->oartifact == '\0')) ||
       (bVar3 = defends(2,local_68), bVar3 == '\0')) {
      spec_dbon_applies = 1;
      spec_applies_ad_fire = '\x01';
      bVar7 = false;
      if (((bVar6) && (bVar7 = false, (u.uprops[1].intrinsic & 0x4000000) != 0)) &&
         ((bVar7 = false, (u.uprops[1].intrinsic & 0xfbffffff) == 0 &&
          (bVar7 = false, u.uprops[1].extrinsic == 0)))) {
        bVar7 = (youmonst.mintrinsics & 1) == 0;
      }
      iVar5 = 6;
      if (bVar7) {
        iVar5 = 3;
      }
      defwep._0_4_ = rnd(iVar5);
    }
  }
LAB_0015977a:
  bVar3 = attacks(3,otmp,olaunch,thrown);
  if (bVar3 != '\0') {
    if (bVar6) {
      if (((u.uprops[2].intrinsic != 0) || (u.uprops[2].extrinsic != 0)) ||
         ((youmonst.mintrinsics & 2) != 0)) {
        if ((((u.uprops[2].intrinsic & 0x4000000) == 0) ||
            ((u.uprops[2].intrinsic & 0xfbffffff) != 0)) ||
           (uVar2 = youmonst.mintrinsics, u.uprops[2].extrinsic != 0)) goto LAB_00159914;
        goto joined_r0x0015983e;
      }
    }
    else {
      uVar2 = mon->mintrinsics;
joined_r0x0015983e:
      if ((uVar2 & 2) != 0) goto LAB_00159914;
    }
    if (((local_68 == (obj *)0x0) || (local_68->oartifact == '\0')) ||
       (bVar3 = defends(3,local_68), bVar3 == '\0')) {
      spec_dbon_applies = 1;
      spec_applies_ad_cold = '\x01';
      bVar7 = false;
      if ((((bVar6) && (bVar7 = false, (u.uprops[2].intrinsic & 0x4000000) != 0)) &&
          (bVar7 = false, (u.uprops[2].intrinsic & 0xfbffffff) == 0)) &&
         (bVar7 = false, u.uprops[2].extrinsic == 0)) {
        bVar7 = (youmonst.mintrinsics & 2) == 0;
      }
      iVar5 = 6;
      if (bVar7) {
        iVar5 = 3;
      }
      iVar5 = rnd(iVar5);
      defwep._0_4_ = iVar5 + (int)defwep;
    }
  }
LAB_00159914:
  bVar3 = attacks(0xf,otmp,olaunch,thrown);
  if (bVar3 != '\0') {
    if (bVar6) {
      if ((u.uprops[0x35].intrinsic != 0) || (u.uprops[0x35].extrinsic != 0)) goto LAB_001599c1;
      cVar4 = resists_drli(&youmonst);
    }
    else {
      cVar4 = resists_drli(mon);
    }
    if ((cVar4 == '\0') &&
       (((local_68 == (obj *)0x0 || (local_68->oartifact == '\0')) ||
        (bVar3 = defends(0xf,local_68), bVar3 == '\0')))) {
      spec_dbon_applies = 1;
      spec_applies_ad_drli = '\x01';
    }
  }
LAB_001599c1:
  bVar3 = oprop_attack(8,otmp,olaunch,thrown);
  if (bVar3 != '\0') {
    spec_dbon_applies = 1;
    spec_applies_spfx_behead = '\x01';
  }
  return (int)defwep;
}

Assistant:

int spec_dbon(struct obj *otmp, struct obj *olaunch, boolean thrown,
	      struct monst *mon, int tmp)
{
	const struct artifact *weap = get_artifact(otmp);
	boolean yours = (mon == &youmonst);

	spec_dbon_applies = FALSE;

	spec_applies_ad_fire = FALSE;
	spec_applies_ad_cold = FALSE;
	spec_applies_ad_elec = FALSE;
	spec_applies_ad_magm = FALSE;
	spec_applies_ad_stun = FALSE;
	spec_applies_ad_drli = FALSE;
	spec_applies_spfx_behead = spec_ability(otmp, SPFX_BEHEAD);

	if (!weap) {
	    /* Object must have properties, which might stack. */
	    int propdmg = 0;
	    struct obj *defwep = (yours ? uwep : MON_WEP(mon));

	    if ((attacks(AD_FIRE, otmp, olaunch, thrown) &&
		!(yours ? FFire_resistance : resists_fire(mon)) &&
		!(defwep && defwep->oartifact && defends(AD_FIRE, defwep)))) {
		spec_dbon_applies = TRUE;
		spec_applies_ad_fire = TRUE;
		propdmg += rnd((yours && PFire_resistance) ? 3 : 6);
	    }

	    if ((attacks(AD_COLD, otmp, olaunch, thrown) &&
		!(yours ? FCold_resistance : resists_cold(mon)) &&
		!(defwep && defwep->oartifact && defends(AD_COLD, defwep)))) {
		spec_dbon_applies = TRUE;
		spec_applies_ad_cold = TRUE;
		propdmg += rnd((yours && PCold_resistance) ? 3 : 6);
	    }

	    /* No AD_MAGM/spec_applies_ad_magm (magic missile) property effect. */

	    /* No AD_STUN/spec_applies_ad_stun (stun) property effect. */

	    /* Life-draining is handled specially in artifact_hit(). */
	    if (attacks(AD_DRLI, otmp, olaunch, thrown) &&
		!(yours ? Drain_resistance : resists_drli(mon)) &&
		!(defwep && defwep->oartifact && defends(AD_DRLI, defwep))) {
		spec_dbon_applies = TRUE;
		spec_applies_ad_drli = TRUE;
	    }

	    /* [SPFX_BEHEAD] This *may* apply; only artifact_hit_behead()
	     * truly decides that. */
	    if (oprop_attack(ITEM_VORPAL, otmp, olaunch, thrown)) {
		spec_dbon_applies = TRUE;
		spec_applies_spfx_behead = TRUE;
	    }

	    return propdmg;
	}

	if (!weap || (weap->attk.adtyp == AD_PHYS && /* check for `NO_ATTK' */
			weap->attk.damn == 0 && weap->attk.damd == 0))
	    spec_dbon_applies = FALSE;
	else
	    spec_dbon_applies = spec_applies(weap, mon);

	if (spec_dbon_applies) {
	    int dmg_bonus = weap->attk.damd ? rnd(weap->attk.damd) : max(tmp, 1);
	    /* halve artifact bonus damage for partial resistances */
	    if (yours && (weap->spfx & SPFX_ATTK)) {
		uchar adtyp = weap->attk.adtyp;
		if ((adtyp == AD_FIRE && PFire_resistance) ||
		    (adtyp == AD_COLD && PCold_resistance) ||
		    (adtyp == AD_ELEC && PShock_resistance) ||
		    (adtyp == AD_DRST && PPoison_resistance)) {
		    dmg_bonus = (dmg_bonus + 1) / 2;
		}
	    }
	    return dmg_bonus;
	}
	return 0;
}